

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::is_out_of_bounds_tessellation_level(CompilerMSL *this,uint32_t id_lhs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  SPIRExpression *pSVar4;
  SPIRConstant *pSVar5;
  bool bVar6;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  if ((((((pSVar3->flags).lower & 0x400000) == 0) ||
       (pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,id_lhs),
       pSVar4 == (SPIRExpression *)0x0)) || (pSVar4->access_chain != true)) ||
     ((uVar2 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(pSVar4->loaded_from).id,DecorationBuiltIn),
      uVar2 - 0xd < 0xfffffffe ||
      (pSVar5 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                          ((Compiler *)this,
                           (pSVar4->implied_read_expressions).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[1].id)
      , pSVar5 == (SPIRConstant *)0x0)))) {
    bVar6 = false;
  }
  else {
    uVar1 = (pSVar5->m).c[0].r[0].u32;
    if (uVar2 == 0xc) {
      bVar6 = uVar1 == 1;
    }
    else {
      bVar6 = uVar1 == 3;
    }
  }
  return bVar6;
}

Assistant:

bool CompilerMSL::is_out_of_bounds_tessellation_level(uint32_t id_lhs)
{
	if (!get_entry_point().flags.get(ExecutionModeTriangles))
		return false;

	// In SPIR-V, TessLevelInner always has two elements and TessLevelOuter always has
	// four. This is true even if we are tessellating triangles. This allows clients
	// to use a single tessellation control shader with multiple tessellation evaluation
	// shaders.
	// In Metal, however, only the first element of TessLevelInner and the first three
	// of TessLevelOuter are accessible. This stems from how in Metal, the tessellation
	// levels must be stored to a dedicated buffer in a particular format that depends
	// on the patch type. Therefore, in Triangles mode, any access to the second
	// inner level or the fourth outer level must be dropped.
	const auto *e = maybe_get<SPIRExpression>(id_lhs);
	if (!e || !e->access_chain)
		return false;
	BuiltIn builtin = BuiltIn(get_decoration(e->loaded_from, DecorationBuiltIn));
	if (builtin != BuiltInTessLevelInner && builtin != BuiltInTessLevelOuter)
		return false;
	auto *c = maybe_get<SPIRConstant>(e->implied_read_expressions[1]);
	if (!c)
		return false;
	return (builtin == BuiltInTessLevelInner && c->scalar() == 1) ||
	       (builtin == BuiltInTessLevelOuter && c->scalar() == 3);
}